

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::OnRethrow(TypeChecker *this,Index depth)

{
  bool bVar1;
  Result RVar2;
  Label *local_28;
  Label *label;
  Result result;
  Index depth_local;
  TypeChecker *this_local;
  
  label._4_4_ = depth;
  _result = this;
  Result::Result((Result *)&label,Ok);
  RVar2 = GetRethrowLabel(this,label._4_4_,&local_28);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    RVar2 = SetUnreachable(this);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      this_local._4_4_ = (Enum)label;
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnRethrow(Index depth) {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(GetRethrowLabel(depth, &label));
  CHECK_RESULT(SetUnreachable());
  return result;
}